

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall
indk::NeuralNet::doSignalProcessStart
          (NeuralNet *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *Xx,EntryList *entries)

{
  _Rb_tree_header *p_Var1;
  vector<float,_std::allocator<float>_> *pvVar2;
  pointer ppVar3;
  pointer pbVar4;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var5;
  pointer pbVar6;
  uint uVar7;
  pointer this_00;
  pointer this_01;
  int iVar8;
  vector<float,_std::allocator<float>_> *__x;
  iterator iVar9;
  iterator iVar10;
  Computer *pCVar11;
  int64_t tn;
  int64_t iVar12;
  bool bVar13;
  pointer From;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *we;
  pointer __k;
  pointer __k_00;
  _Rb_tree_color _Var15;
  ulong uVar16;
  long lVar17;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var18;
  float X_00;
  pair<long,_float> pVar19;
  long local_120;
  long local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  waiting;
  vector<float,_std::allocator<float>_> X;
  string local_90 [32];
  string local_70 [32];
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_void_*,_int>_> to;
  
  lVar17 = this->t;
  pvVar2 = (Xx->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &(this->Latencies)._M_t._M_impl.super__Rb_tree_header;
  for (__x = (Xx->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
    std::vector<float,_std::allocator<float>_>::vector(&X,__x);
    From = (entries->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (entries->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_f8 = 0;
    for (; From != ppVar3; From = From + 1) {
      pbVar4 = (From->second).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (From->second).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pbVar4; __k = __k + 1) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                ::find(&(this->Neurons)._M_t,__k);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&(this->Latencies)._M_t,__k);
        if ((_Rb_tree_header *)iVar10._M_node == p_Var1) {
          _Var15 = _S_red;
        }
        else {
          _Var15 = iVar10._M_node[2]._M_color;
        }
        Neuron::getWaitingEntries_abi_cxx11_(&waiting,*(Neuron **)(iVar9._M_node + 2));
        pbVar6 = waiting.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__k_00 = waiting.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; __k_00 != pbVar6;
            __k_00 = __k_00 + 1) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&(this->Latencies)._M_t,__k_00);
          if (((_Rb_tree_header *)iVar10._M_node != p_Var1) &&
             ((int)_Var15 < (int)iVar10._M_node[2]._M_color)) {
            Neuron::doSignalSendEntry(*(Neuron **)(iVar9._M_node + 2),__k_00,0.0,0);
          }
        }
        if ((_Rb_tree_header *)iVar9._M_node != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header)
        {
          Neuron::doSignalSendEntry
                    (*(Neuron **)(iVar9._M_node + 2),&From->first,
                     *(float *)(CONCAT44(X.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         (uint)X.super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start) +
                               local_f8 * 4),this->t);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&waiting);
      }
      local_f8 = local_f8 + 1;
    }
    this->t = this->t + 1;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&X.super__Vector_base<float,_std::allocator<float>_>);
  }
  iVar8 = System::getComputeBackendKind();
  if (iVar8 == 2) {
    pCVar11 = System::getComputeBackend();
    (*pCVar11->_vptr_Computer[2])(pCVar11);
  }
  lVar14 = 1;
  if ((Xx->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (Xx->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar14 = this->t - lVar17;
  }
  local_120 = 0;
  do {
    if (local_120 == lVar14) {
      return;
    }
    p_Var18 = &((this->Links).
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
    ;
    p_Var5 = &((this->Links).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
    ;
    uVar16 = 0;
    while( true ) {
      if (p_Var18 == p_Var5) break;
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     *)&X,p_Var18);
      std::__cxx11::string::string((string *)&waiting,local_70);
      std::__cxx11::string::string((string *)&to,local_90);
      this_01 = X.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
      this_00 = X.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      uVar7 = (uint)X.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      tn = Neuron::getTime((Neuron *)
                           X.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      iVar12 = Neuron::getTime((Neuron *)this_00);
      bVar13 = true;
      if (iVar12 != this->t) {
        X_00 = 0.0;
        if (tn != 0 || -1 < (int)uVar7) {
          lVar17 = tn - (ulong)(uVar7 >> 0x1f);
          iVar8 = Neuron::getState((Neuron *)this_01,lVar17);
          if (iVar8 != 2) {
            iVar8 = System::getComputeBackendKind();
            bVar13 = iVar8 == 2;
            goto LAB_001104cb;
          }
          pVar19 = Neuron::doSignalReceive((Neuron *)this_01,lVar17);
          X_00 = pVar19.second;
        }
        Neuron::doSignalSendEntry((Neuron *)this_00,(string *)&waiting,X_00,tn);
        iVar8 = System::getComputeBackendKind();
        if (iVar8 == 2) {
          bVar13 = tn == this->t ||
                   (Xx->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start !=
                   (Xx->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          bVar13 = tn == this->t;
        }
      }
LAB_001104cb:
      uVar16 = (ulong)((int)uVar16 + (uint)bVar13);
      std::__cxx11::string::~string((string *)&to);
      std::__cxx11::string::~string((string *)&waiting);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                      *)&X);
      p_Var18 = p_Var18 + 1;
    }
    if (((long)(this->Links).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->Links).
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x58 == uVar16) {
      local_120 = local_120 + 1;
    }
    else if ((Xx->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start ==
             (Xx->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
      pCVar11 = System::getComputeBackend();
      (*pCVar11->_vptr_Computer[2])(pCVar11);
    }
  } while( true );
}

Assistant:

void indk::NeuralNet::doSignalProcessStart(const std::vector<std::vector<float>>& Xx, const EntryList& entries) {
    float value;
    int d = 0;

    int64_t dt = t;

    for (auto X: Xx) {
        int xi = 0;
        for (auto &e: entries) {
            for (auto &en: e.second) {
                auto n = Neurons.find(en);

                auto lto = Latencies.find(en);
                auto latencyto = lto != Latencies.end() ? lto->second : 0;
                auto waiting = n -> second -> getWaitingEntries();
                for (auto &we: waiting) {
                    auto nprev = Latencies.find(we);
                    if (nprev != Latencies.end() && nprev->second > latencyto) {
                        n -> second -> doSignalSendEntry(we, 0, 0);
                    }
                }

                if (n != Neurons.end())
                    n -> second -> doSignalSendEntry(e.first, X[xi], t);
            }
            xi++;
        }
        t++;
    }

    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
        indk::System::getComputeBackend() -> doWaitTarget();

    dt = t - dt;
    if (Xx.empty()) dt = 1;
    int64_t lt = 0;

    while (lt != dt) {
        d = 0;

        for (auto l: Links) {
            auto from = std::get<0>(l);
            auto to = std::get<1>(l);

            auto nfrom = (indk::Neuron*)std::get<2>(l);
            auto nto = (indk::Neuron*)std::get<3>(l);
            auto latency = std::get<4>(l);
            auto time = nto -> getTime();

            if (nto->getTime() == t) {
                d++;
                continue;
            }

            value = 0;
            if (!time && latency >= 0 || time) {
                auto shift = (bool)latency;
                if (latency > 0) shift = false;
                if (nfrom->getState(time-shift) != indk::Neuron::States::Computed) {
                    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
                        d++;
                    continue;
                }
                value = nfrom -> doSignalReceive(time-shift).second;
            }


            nto -> doSignalSendEntry(from, value, time);

            if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL) {
                if (!Xx.empty() || Xx.empty() && time == t) {
                    d++;
                }
            } else if (time == t) {
                d++;
            }
        }

        if (d == Links.size()) {
            lt++;
        } else if (Xx.empty()) indk::System::getComputeBackend() -> doWaitTarget();
    }
}